

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O2

void Sbc_ManCriticalPath_rec
               (Gia_Man_t *p,int *pLevels,int iObj,int LevelFan,Vec_Bit_t *vPath,int Slack)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int Entry;
  uint uVar6;
  int iVar7;
  int Slack_00;
  long lVar8;
  bool bVar9;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar4 = Gia_ManObj(p,iObj);
    Vec_BitWriteEntry(vPath,iObj,Entry);
    uVar6 = (uint)*(undefined8 *)pGVar4;
    if ((~uVar6 & 0x9fffffff) == 0) {
      p_00 = (Tim_Man_t *)p->pManTime;
      if (p_00 != (Tim_Man_t *)0x0) {
        iVar1 = Tim_ManBoxForCi(p_00,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff);
        if (-1 < iVar1) {
          iVar2 = Tim_ManBoxInputFirst(p_00,iVar1);
          iVar3 = Tim_ManBoxInputNum(p_00,iVar1);
          iVar1 = 0;
          if (0 < iVar3) {
            iVar1 = iVar3;
          }
          while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
            pGVar4 = Gia_ManCo(p,iVar2);
            iVar3 = Gia_ObjFaninId0p(p,pGVar4);
            iVar7 = pLevels[iVar3] + Slack;
            Slack_00 = iVar7 - (LevelFan + -1);
            if (iVar3 != 0 && LevelFan + -1 <= iVar7) {
              if (Slack_00 < 1) {
                Slack_00 = 0;
              }
              Sbc_ManCriticalPath_rec(p,pLevels,iVar3,pLevels[iVar3],vPath,Slack_00);
            }
            iVar2 = iVar2 + 1;
          }
        }
      }
    }
    else {
      if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                      ,0x72,
                      "void Sbc_ManCriticalPath_rec(Gia_Man_t *, int *, int, int, Vec_Bit_t *, int)"
                     );
      }
      lVar8 = 0;
      while( true ) {
        iVar1 = Gia_ObjLutSize(p,iObj);
        if (iVar1 <= lVar8) break;
        piVar5 = Gia_ObjLutFanins(p,iObj);
        iVar1 = pLevels[piVar5[lVar8]] + Slack;
        iVar2 = iVar1 - (LevelFan + -1);
        if (LevelFan + -1 <= iVar1) {
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          Sbc_ManCriticalPath_rec(p,pLevels,piVar5[lVar8],pLevels[piVar5[lVar8]],vPath,iVar2);
        }
        lVar8 = lVar8 + 1;
      }
    }
  }
  return;
}

Assistant:

void Sbc_ManCriticalPath_rec( Gia_Man_t * p, int * pLevels, int iObj, int LevelFan, Vec_Bit_t * vPath, int Slack )
{
    Gia_Obj_t * pObj; int k, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    Vec_BitWriteEntry( vPath, iObj, 1 );
    if ( Gia_ObjIsCi(pObj) )
    {
        Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
        int iBox = pManTime ? Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) ) : -1;
        if ( iBox >= 0 )
        {
            int curCo = Tim_ManBoxInputFirst( pManTime, iBox );
            int nBoxInputs = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nBoxInputs; k++ )
            {
                Gia_Obj_t * pCo = Gia_ManCo( p, curCo + k );
                int iDriver = Gia_ObjFaninId0p( p, pCo );
                if ( (pLevels[iDriver]+Slack >= LevelFan-1) && iDriver )
                    Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Abc_MaxInt(0, pLevels[iDriver]+Slack-(LevelFan-1)) );
            }
        }
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        if ( pLevels[iFan]+Slack >= LevelFan-1 )
            Sbc_ManCriticalPath_rec( p, pLevels, iFan, pLevels[iFan], vPath, Abc_MaxInt(0, pLevels[iFan]+Slack-(LevelFan-1)) );
}